

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
::~btree(btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
         *this)

{
  if (this->size_ != 0) {
    btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
    ::clear_and_delete(this->root_,(allocator_type *)&this->rightmost_);
  }
  (this->rightmost_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
  .value = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            *)btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
              ::EmptyNode()::empty_node;
  this->root_ = (node_type *)
                btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::EmptyNode()::empty_node;
  this->size_ = 0;
  return;
}

Assistant:

~btree() {
    // Put static_asserts in destructor to avoid triggering them before the type
    // is complete.
    static_assert(static_assert_validation(), "This call must be elided.");
    clear();
  }